

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O2

CMNode * __thiscall
xercesc_4_0::DFAContentModel::buildSyntaxTree
          (DFAContentModel *this,ContentSpecNode *curNode,uint *curIndex)

{
  NodeTypes NVar1;
  ContentSpecNode *curNode_00;
  ContentSpecNode *pCVar2;
  uint uVar3;
  CMLeaf *pCVar4;
  QName *this_00;
  ulong uVar5;
  CMNode *pCVar6;
  CMStateSet *pCVar7;
  CMStateSet *pCVar8;
  CMRepeatingLeaf *pCVar9;
  CMNode *this_01;
  RuntimeException *this_02;
  NodeTypes type;
  ContentSpecNode *curNode_01;
  int iVar10;
  int iVar11;
  CMRepeatingLeaf *local_68;
  CMStateSetEnumerator enumLast;
  
  type = curNode->fType;
  if ((uint)((type & (Any_NS|Any_Other)) + ~Sequence) < 3) {
    local_68 = (CMRepeatingLeaf *)XMemory::operator_new(0x38,this->fMemoryManager);
    CMAny::CMAny((CMAny *)local_68,type,curNode->fElement->fURIId,*curIndex,this->fLeafCount,
                 this->fMemoryManager);
    pCVar4 = (CMLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    this_00 = (QName *)XMemory::operator_new(0x48,this->fMemoryManager);
    QName::QName(this_00,L"",L"",curNode->fElement->fURIId,this->fMemoryManager);
    CMLeaf::CMLeaf(pCVar4,this_00,*curIndex,true,this->fLeafCount,this->fMemoryManager);
    uVar5 = (ulong)*curIndex;
    this->fLeafList[uVar5] = pCVar4;
  }
  else if (type == Loop) {
    local_68 = (CMRepeatingLeaf *)XMemory::operator_new(0x48,this->fMemoryManager);
    CMRepeatingLeaf::CMRepeatingLeaf
              (local_68,curNode->fFirst->fElement,curNode->fMinOccurs,curNode->fMaxOccurs,*curIndex,
               this->fLeafCount,this->fMemoryManager);
    pCVar9 = (CMRepeatingLeaf *)XMemory::operator_new(0x48,this->fMemoryManager);
    CMRepeatingLeaf::CMRepeatingLeaf
              (pCVar9,curNode->fFirst->fElement,curNode->fMinOccurs,curNode->fMaxOccurs,*curIndex,
               this->fLeafCount,this->fMemoryManager);
    uVar5 = (ulong)*curIndex;
    this->fLeafList[uVar5] = (CMLeaf *)pCVar9;
    type = curNode->fFirst->fType;
  }
  else {
    if (type != Leaf) {
      curNode_00 = curNode->fSecond;
      iVar10 = 0;
      curNode_01 = curNode;
      NVar1 = type;
      while (((NVar1 == Sequence && (pCVar2 = curNode_01->fFirst, pCVar2 != (ContentSpecNode *)0x0))
             && (pCVar2->fSecond == curNode_00))) {
        iVar10 = iVar10 + 1;
        NVar1 = pCVar2->fType;
        curNode_01 = pCVar2;
      }
      if (iVar10 == 0) {
        if ((type & (Any_NS|Any)) == Choice) {
          pCVar6 = buildSyntaxTree(this,curNode->fFirst,curIndex);
          this_01 = buildSyntaxTree(this,curNode_00,curIndex);
          if ((type & (Any_NS|Any_Other)) == Sequence) {
            pCVar7 = CMNode::getLastPos(pCVar6);
            pCVar8 = CMNode::getFirstPos(this_01);
            CMStateSetEnumerator::CMStateSetEnumerator(&enumLast,pCVar7,0);
            while (enumLast.fLastValue != 0) {
              uVar3 = CMStateSetEnumerator::nextElement(&enumLast);
              CMStateSet::operator|=(this->fFollowList[uVar3],pCVar8);
            }
          }
          local_68 = (CMRepeatingLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
          CMBinaryOp::CMBinaryOp
                    ((CMBinaryOp *)local_68,type,pCVar6,this_01,this->fLeafCount,
                     this->fMemoryManager);
        }
        else {
          if (3 < (uint)type) {
            this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
            RuntimeException::RuntimeException
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/DFAContentModel.cpp"
                       ,0x67d,CM_UnknownCMSpecType,this->fMemoryManager);
            __cxa_throw(this_02,&RuntimeException::typeinfo,XMLException::~XMLException);
          }
          pCVar6 = buildSyntaxTree(this,curNode->fFirst,curIndex);
          if (type != ZeroOrOne) {
            pCVar7 = CMNode::getFirstPos(pCVar6);
            pCVar8 = CMNode::getLastPos(pCVar6);
            CMStateSetEnumerator::CMStateSetEnumerator(&enumLast,pCVar8,0);
            while (enumLast.fLastValue != 0) {
              uVar3 = CMStateSetEnumerator::nextElement(&enumLast);
              CMStateSet::operator|=(this->fFollowList[uVar3],pCVar7);
            }
          }
          local_68 = (CMRepeatingLeaf *)XMemory::operator_new(0x38,this->fMemoryManager);
          CMUnaryOp::CMUnaryOp
                    ((CMUnaryOp *)local_68,type,pCVar6,this->fLeafCount,this->fMemoryManager);
        }
      }
      else {
        local_68 = (CMRepeatingLeaf *)buildSyntaxTree(this,curNode_01,curIndex);
        for (iVar11 = 0; iVar10 != iVar11; iVar11 = iVar11 + 1) {
          pCVar6 = buildSyntaxTree(this,curNode_00,curIndex);
          pCVar7 = CMNode::getLastPos((CMNode *)local_68);
          pCVar8 = CMNode::getFirstPos(pCVar6);
          CMStateSetEnumerator::CMStateSetEnumerator(&enumLast,pCVar7,0);
          while (enumLast.fLastValue != 0) {
            uVar3 = CMStateSetEnumerator::nextElement(&enumLast);
            CMStateSet::operator|=(this->fFollowList[uVar3],pCVar8);
          }
          pCVar9 = (CMRepeatingLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
          CMBinaryOp::CMBinaryOp
                    ((CMBinaryOp *)pCVar9,Sequence,(CMNode *)local_68,pCVar6,this->fLeafCount,
                     this->fMemoryManager);
          local_68 = pCVar9;
        }
      }
      if (iVar10 != 0) {
        return (CMNode *)local_68;
      }
      goto LAB_002e41f6;
    }
    local_68 = (CMRepeatingLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    CMLeaf::CMLeaf((CMLeaf *)local_68,curNode->fElement,*curIndex,this->fLeafCount,
                   this->fMemoryManager);
    pCVar4 = (CMLeaf *)XMemory::operator_new(0x40,this->fMemoryManager);
    CMLeaf::CMLeaf(pCVar4,curNode->fElement,*curIndex,this->fLeafCount,this->fMemoryManager);
    uVar5 = (ulong)*curIndex;
    this->fLeafList[uVar5] = pCVar4;
    type = Leaf;
  }
  this->fLeafListType[uVar5] = type;
  *curIndex = (int)uVar5 + 1;
LAB_002e41f6:
  CMNode::getFirstPos((CMNode *)local_68);
  CMNode::getLastPos((CMNode *)local_68);
  (*(local_68->super_CMLeaf).super_CMNode._vptr_CMNode[2])(local_68);
  return (CMNode *)local_68;
}

Assistant:

CMNode* DFAContentModel::buildSyntaxTree(ContentSpecNode* const curNode
                                         , unsigned int&        curIndex)
{
    // Initialize a return node pointer
    CMNode* retNode = 0;

    // Get the spec type of the passed node
    const ContentSpecNode::NodeTypes curType = curNode->getType();

    if ((curType & 0x0f) == ContentSpecNode::Any
        || (curType & 0x0f) == ContentSpecNode::Any_Other
        || (curType & 0x0f) == ContentSpecNode::Any_NS)
    {
        retNode = new (fMemoryManager) CMAny
        (
            curType
            , curNode->getElement()->getURI()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafList[curIndex] = new (fMemoryManager) CMLeaf
        (
            new (fMemoryManager) QName
            (
                XMLUni::fgZeroLenString
                , XMLUni::fgZeroLenString
                , curNode->getElement()->getURI()
                , fMemoryManager
            )
            , curIndex
            , true
            , fLeafCount
            , fMemoryManager
        );
        fLeafListType[curIndex] = curType;
        ++curIndex;
    }
    else if (curType == ContentSpecNode::Leaf)
    {
        //
        //  Create a new leaf node, and pass it the current leaf count, which
        //  is its DFA state position. Bump the leaf count after storing it.
        //  This makes the positions zero based since we store first and then
        //  increment.
        //
        retNode = new (fMemoryManager) CMLeaf
        (
            curNode->getElement()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        try
        {
            fLeafList[curIndex] = new (fMemoryManager) CMLeaf
            (
                curNode->getElement()
                , curIndex
                , fLeafCount
                , fMemoryManager
            );
        }
        catch( const OutOfMemoryException& )
        {
            delete retNode;
            throw;
        }
        fLeafListType[curIndex] = ContentSpecNode::Leaf;
        ++curIndex;
    }
    else if (curType == ContentSpecNode::Loop)
    {
        //
        //  Create a new leaf node, and pass it the current leaf count, which
        //  is its DFA state position. Bump the leaf count after storing it.
        //  This makes the positions zero based since we store first and then
        //  increment.
        //
        retNode = new (fMemoryManager) CMRepeatingLeaf
        (
            curNode->getFirst()->getElement()
            , curNode->getMinOccurs()
            , curNode->getMaxOccurs()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafList[curIndex] = new (fMemoryManager) CMRepeatingLeaf
        (
            curNode->getFirst()->getElement()
            , curNode->getMinOccurs()
            , curNode->getMaxOccurs()
            , curIndex
            , fLeafCount
            , fMemoryManager
        );
        fLeafListType[curIndex] = curNode->getFirst()->getType();
        ++curIndex;
    }
     else
    {
        //
        //  Its not a leaf, so we have to recurse its left and maybe right
        //  nodes. Save both values before we recurse and trash the node.
        //
        ContentSpecNode* leftNode = curNode->getFirst();
        ContentSpecNode* rightNode = curNode->getSecond();

        // Detect if we have a deep tree that can be analyzed using a loop instead of recursion
        unsigned int nLoopCount=0;
        ContentSpecNode* cursor=curNode;
        while(cursor->getType()==ContentSpecNode::Sequence && cursor->getFirst() && cursor->getFirst()->getSecond()==rightNode)
        {
            nLoopCount++;
            cursor=cursor->getFirst();
        }
        if(nLoopCount!=0)
        {
            retNode = buildSyntaxTree(cursor, curIndex);
            for(unsigned int i=0;i<nLoopCount;i++)
            {
                CMNode* newRight = nullptr;
                try
                {
                    newRight = buildSyntaxTree(rightNode, curIndex);

                    //
                    //  Now handle our level. We use our left child's last pos set and our
                    //  right child's first pos set, so get them now for convenience.
                    //
                    const CMStateSet& last  = retNode->getLastPos();
                    const CMStateSet& first = newRight->getFirstPos();

                    //
                    //  Now, for every position which is in our left child's last set
                    //  add all of the states in our right child's first set to the
                    //  follow set for that position.
                    //
                    CMStateSetEnumerator enumLast(&last);
                    while(enumLast.hasMoreElements())
                    {
                        XMLSize_t index=enumLast.nextElement();
                        *fFollowList[index] |= first;
                    }

                    retNode = new (fMemoryManager) CMBinaryOp
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , newRight
                        , fLeafCount
                        , fMemoryManager
                    );
                }
                catch( const OutOfMemoryException& )
                {
                    delete newRight;
                    delete retNode;
                    throw;
                }
            }
            return retNode;
        }

        if (((curType & 0x0f) == ContentSpecNode::Choice)
        ||   ((curType & 0x0f) == ContentSpecNode::Sequence))
        {
            //
            //  Recurse on both children, and return a binary op node with the
            //  two created sub nodes as its children. The node type is the
            //  same type as the source.
            //
            CMNode* newLeft = buildSyntaxTree(leftNode, curIndex);
            CMNode* newRight;
            try
            {
                newRight = buildSyntaxTree(rightNode, curIndex);
            }
            catch( const OutOfMemoryException& )
            {
                delete newLeft;
                throw;
            }
            if(((curType & 0x0f) == ContentSpecNode::Sequence))
            {
                //
                //  Now handle our level. We use our left child's last pos set and our
                //  right child's first pos set, so get them now for convenience.
                //
                const CMStateSet& last  = newLeft->getLastPos();
                const CMStateSet& first = newRight->getFirstPos();

                //
                //  Now, for every position which is in our left child's last set
                //  add all of the states in our right child's first set to the
                //  follow set for that position.
                //
                CMStateSetEnumerator enumLast(&last);
                while(enumLast.hasMoreElements())
                {
                    XMLSize_t index=enumLast.nextElement();
                    *fFollowList[index] |= first;
                }
            }
            try
            {
                retNode = new (fMemoryManager) CMBinaryOp
                (
                    curType
                    , newLeft
                    , newRight
                    , fLeafCount
                    , fMemoryManager
                );
            }
            catch( const OutOfMemoryException& )
            {
                delete newLeft;
                delete newRight;
                throw;
            }
        }
         else if (curType == ContentSpecNode::ZeroOrMore
               || curType == ContentSpecNode::ZeroOrOne
               || curType == ContentSpecNode::OneOrMore)
        {
            CMNode* newChild = buildSyntaxTree(leftNode, curIndex);
            if (curType == ContentSpecNode::ZeroOrMore
               || curType == ContentSpecNode::OneOrMore)
            {
                //
                //  Now handle our level. We use our own first and last position
                //  sets, so get them up front.
                //
                const CMStateSet& first = newChild->getFirstPos();
                const CMStateSet& last  = newChild->getLastPos();

                //
                //  For every position which is in our last position set, add all
                //  of our first position states to the follow set for that
                //  position.
                //
                CMStateSetEnumerator enumLast(&last);
                while(enumLast.hasMoreElements())
                {
                    XMLSize_t index=enumLast.nextElement();
                    *fFollowList[index] |= first;
                }
            }
            // This one is fine as is, just change to our form
            retNode = new (fMemoryManager) CMUnaryOp
            (
                curType
                , newChild
                , fLeafCount
                , fMemoryManager
            );
        }
         else
        {
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, fMemoryManager);
        }
    }
    // fault in the first and last pos, then delete it children
    try
    {
        retNode->getFirstPos();
        retNode->getLastPos();
        retNode->orphanChild();
    }
    catch( const OutOfMemoryException& )
    {
        delete retNode;
        throw;
    }
    return retNode;
}